

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
     ::resize_impl(CommonFields *common,Symbol *new_capacity)

{
  long lVar1;
  ulong c;
  ctrl_t *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  SymbolByParentHash *this;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  CommonFields *pCVar8;
  byte bVar9;
  Symbol *s;
  CommonFields *s_00;
  long lVar10;
  ctrl_t cVar11;
  byte bVar12;
  FindInfo FVar13;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == (Symbol *)0x0) ||
     (((ulong)((long)&new_capacity->ptr_ + 1U) & (ulong)new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  if (new_capacity < (Symbol *)0x2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  sVar6 = common->capacity_;
  if (sVar6 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  bVar12 = 0x80;
  if (sVar6 == 1) {
    s = new_capacity;
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)0x1);
    if (1 < common->size_) {
      this = (SymbolByParentHash *)
             soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       *)common);
      sVar5 = google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()(this,s);
      bVar12 = (byte)sVar5 & 0x7f;
      bVar9 = 1;
      goto LAB_00178270;
    }
  }
  bVar9 = 0;
LAB_00178270:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar6 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_3e = bVar9;
  CommonFields::set_capacity(common,(size_t)new_capacity);
  s_00 = common;
  bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar12,8,8);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  if ((bVar9 | sVar6 != 1) == 1) {
    lVar1 = *(long *)((long)&common->heap_or_soo_ + 8);
    slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)common->capacity_);
    uVar3 = local_58.heap.slot_array;
    if (!bVar4) {
      if (sVar6 == 1) {
        sVar6 = google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
                          ((SymbolByParentHash *)&local_58.heap,(Symbol *)s_00);
        FVar13 = find_first_non_full<void>(common,sVar6);
        uVar7 = FVar13.offset;
        c = common->capacity_;
        if (c <= uVar7) {
LAB_00178465:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar11 = (ctrl_t)sVar6 & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar7] = cVar11;
        pcVar2[(ulong)((uint)c & 0xf) + (uVar7 - 0xf & c)] = cVar11;
        common->capacity_ = 0xffffffffffffff9c;
        *(ctrl_t **)(lVar1 + uVar7 * 8) = local_58.heap.control;
        CommonFields::set_capacity(common,c);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          lVar10 = 0;
          sVar5 = 0;
          sVar6 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar5]) {
              sVar6 = google::protobuf::(anonymous_namespace)::SymbolByParentHash::operator()
                                ((SymbolByParentHash *)(uVar3 + lVar10),(Symbol *)s_00);
              FVar13 = find_first_non_full<void>(common,sVar6);
              pCVar8 = (CommonFields *)FVar13.offset;
              s_00 = (CommonFields *)common->capacity_;
              if (s_00 <= pCVar8) goto LAB_00178465;
              cVar11 = (ctrl_t)sVar6 & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              *(ctrl_t *)((long)&pCVar8->capacity_ + (long)pcVar2) = cVar11;
              pcVar2[(ulong)((uint)s_00 & 0xf) +
                     ((ulong)((long)&pCVar8[-1].heap_or_soo_ + 1U) & (ulong)s_00)] = cVar11;
              common->capacity_ = 0xffffffffffffff9c;
              *(undefined8 *)(lVar1 + (long)pCVar8 * 8) = *(undefined8 *)(uVar3 + sVar5 * 8);
              CommonFields::set_capacity(common,(size_t)s_00);
              sVar6 = local_48;
            }
            sVar5 = sVar5 + 1;
            lVar10 = lVar10 + 8;
          } while (sVar5 != sVar6);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }